

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.h
# Opt level: O3

SCC * __thiscall
google::protobuf::compiler::
SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::GetSCC
          (SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator> *this,
          Descriptor *descriptor)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  NodeData NVar5;
  Descriptor *local_8;
  
  p_Var2 = (this->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_8 = descriptor;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var1 = &(this->cache_)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var1->_M_header;
    do {
      if (*(Descriptor **)(p_Var2 + 1) >= descriptor) {
        p_Var4 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[*(Descriptor **)(p_Var2 + 1) < descriptor];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var4 != p_Var1) && (*(Descriptor **)(p_Var4 + 1) <= descriptor)) {
      pmVar3 = std::
               map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData>_>_>
               ::operator[](&this->cache_,&local_8);
      return pmVar3->scc;
    }
  }
  NVar5 = DFS(this,descriptor);
  return NVar5.scc;
}

Assistant:

const SCC* GetSCC(const Descriptor* descriptor) {
    if (cache_.count(descriptor)) return cache_[descriptor].scc;
    return DFS(descriptor).scc;
  }